

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

pair<int,_double>
mxx::scatter_one<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs,int root,
          comm *comm)

{
  pair<int,_double> pVar1;
  int rank;
  pair<int,_double> result;
  uint local_3c;
  pair<int,_double> local_38;
  
  if ((comm->m_rank == root) &&
     ((long)(msgs->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(msgs->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4 != (long)comm->m_size)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_3c);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_3c,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0xfe,"scatter_one",
           "comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_38.first = 0;
  local_38.second = 0.0;
  scatter<std::pair<int,double>>
            ((msgs->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start,1,&local_38,root,comm);
  pVar1._4_4_ = 0;
  pVar1.first = local_38.first;
  pVar1.second = local_38.second;
  return pVar1;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}